

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_instructions(vec *instructions,int format_blank_count,_Bool format_is_block)

{
  instruction *inst;
  int local_24;
  int local_20;
  int j_1;
  int j;
  int i;
  _Bool format_is_block_local;
  int format_blank_count_local;
  vec *instructions_local;
  
  for (j_1 = 0; (ulong)(long)j_1 < instructions->size; j_1 = j_1 + 1) {
    printf("             ");
    if ((format_is_block) && ((long)j_1 == instructions->size - 1)) {
      for (local_20 = 0; local_20 < format_blank_count + -2; local_20 = local_20 + 1) {
        printf(" ");
      }
    }
    else {
      for (local_24 = 0; local_24 < format_blank_count; local_24 = local_24 + 1) {
        printf(" ");
      }
    }
    inst = (instruction *)(*instructions->get_ele)(instructions,(long)j_1);
    print_instruction(inst,format_blank_count);
  }
  return;
}

Assistant:

void print_instructions(vec *instructions, int format_blank_count, bool format_is_block) {
    for (int i = 0; i < instructions->size; ++i) {
        printf("             ");
        if (format_is_block && i == instructions->size - 1) {
            for (int j = 0; j < format_blank_count - 2; ++j) {
                printf(" ");
            }
        } else {
            for (int j = 0; j < format_blank_count; ++j) {
                printf(" ");
            }
        }
        print_instruction((instruction *) (instructions->get_ele(instructions, i)), format_blank_count);
    }
}